

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_by_code.c
# Opt level: O0

int archive_read_support_format_by_code(archive *a,int format_code)

{
  int iVar1;
  undefined4 in_ESI;
  int magic_test;
  archive *in_stack_00000020;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  archive *in_stack_ffffffffffffffd8;
  undefined2 uVar2;
  char cVar3;
  undefined1 uVar4;
  undefined4 local_4;
  
  uVar2 = (undefined2)in_ESI;
  cVar3 = (char)((uint)in_ESI >> 0x10);
  uVar4 = (undefined1)((uint)in_ESI >> 0x18);
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = L'\xffffffe2';
  }
  else if (cVar3 == '\x01') {
    local_4 = archive_read_support_format_cpio(a);
  }
  else if (cVar3 == '\x03') {
    local_4 = archive_read_support_format_tar(a);
  }
  else if (cVar3 == '\x04') {
    local_4 = archive_read_support_format_iso9660(a);
  }
  else if (cVar3 == '\x05') {
    local_4 = archive_read_support_format_zip(in_stack_ffffffffffffffd8);
  }
  else if (cVar3 == '\a') {
    local_4 = archive_read_support_format_ar(a);
  }
  else if (cVar3 == '\b') {
    local_4 = archive_read_support_format_mtree(a);
  }
  else if (cVar3 == '\n') {
    local_4 = archive_read_support_format_xar
                        ((archive *)CONCAT17(uVar4,CONCAT16(10,CONCAT24(uVar2,iVar1))));
  }
  else if (cVar3 == '\v') {
    local_4 = archive_read_support_format_lha(a);
  }
  else if (cVar3 == '\f') {
    local_4 = archive_read_support_format_cab(a);
  }
  else if (cVar3 == '\r') {
    local_4 = archive_read_support_format_rar(in_stack_00000020);
  }
  else if (cVar3 == '\x0e') {
    local_4 = archive_read_support_format_7zip(a);
  }
  else {
    local_4 = L'\xffffffe2';
  }
  return local_4;
}

Assistant:

int
archive_read_support_format_by_code(struct archive *a, int format_code)
{
	archive_check_magic(a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_by_code");

	switch (format_code & ARCHIVE_FORMAT_BASE_MASK) {
	case ARCHIVE_FORMAT_7ZIP:
		return archive_read_support_format_7zip(a);
		break;
	case ARCHIVE_FORMAT_AR:
		return archive_read_support_format_ar(a);
		break;
	case ARCHIVE_FORMAT_CAB:
		return archive_read_support_format_cab(a);
		break;
	case ARCHIVE_FORMAT_CPIO:
		return archive_read_support_format_cpio(a);
		break;
	case ARCHIVE_FORMAT_ISO9660:
		return archive_read_support_format_iso9660(a);
		break;
	case ARCHIVE_FORMAT_LHA:
		return archive_read_support_format_lha(a);
		break;
	case ARCHIVE_FORMAT_MTREE:
		return archive_read_support_format_mtree(a);
		break;
	case ARCHIVE_FORMAT_RAR:
		return archive_read_support_format_rar(a);
		break;
	case ARCHIVE_FORMAT_TAR:
		return archive_read_support_format_tar(a);
		break;
	case ARCHIVE_FORMAT_XAR:
		return archive_read_support_format_xar(a);
		break;
	case ARCHIVE_FORMAT_ZIP:
		return archive_read_support_format_zip(a);
		break;
	}
	return (ARCHIVE_FATAL);
}